

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void Predict(string *test_file,string *predict_file)

{
  pointer pcVar1;
  int __fd;
  clock_t cVar2;
  ulong uVar3;
  int i;
  int iVar4;
  int cnt_per_thread;
  vector<std::thread,_std::allocator<std::thread>_> thread_vec;
  char *buf;
  int local_90;
  int local_8c;
  vector<std::thread,_std::allocator<std::thread>_> local_88;
  clock_t local_68;
  string *local_60;
  reference_wrapper<std::vector<char,_std::allocator<char>_>_> local_58;
  char *local_50;
  vector<char,_std::allocator<char>_> local_48;
  
  local_60 = predict_file;
  local_68 = clock();
  iVar4 = 0;
  __fd = open((test_file->_M_dataplus)._M_p,0);
  local_50 = (char *)mmap((void *)0x0,120000000,1,2,__fd,0);
  madvise(local_50,120000000,2);
  close(__fd);
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)operator_new(20000);
  pcVar1 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start + 20000;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar1;
  memset(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,0x31,20000);
  local_8c = 0x9c4;
  local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = pcVar1;
  do {
    local_90 = local_8c * iVar4;
    local_58._M_data = &local_48;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(char*,int,int,std::vector<char,std::allocator<char>>&),char*&,int,int&,std::reference_wrapper<std::vector<char,std::allocator<char>>>>
              ((vector<std::thread,std::allocator<std::thread>> *)&local_88,JudgePart,&local_50,
               &local_90,&local_8c,&local_58);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 8);
  if (local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      std::thread::join();
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)local_88.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_88.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  cVar2 = clock();
  printf(anon_var_dwarf_8f39,SUB84((double)(cVar2 - local_68) / 1000000.0,0));
  StorePredict(&local_48,local_60);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_88);
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Predict (const string & test_file, const string & predict_file) {
#ifdef TEST
    clock_t start_time = clock();
#endif

    int fd = open(test_file.c_str(), O_RDONLY);
    char * buf = (char *) mmap(NULL, 120000000, PROT_READ, MAP_PRIVATE, fd, 0);
    madvise(buf, 120000000, MADV_SEQUENTIAL);
    close(fd);

    vector<char> res(20000, '1');

    int thread_num = 8;
    int cnt_per_thread = 20000 / thread_num;
    vector<thread> thread_vec;
    for (int i = 0; i < thread_num; i++) {
        thread_vec.emplace_back(JudgePart, buf, i * cnt_per_thread, cnt_per_thread, ref(res));
    }

    for (int i = 0; i < thread_vec.size(); i++) {
        thread_vec[i].join();
    }

#ifdef TEST
    clock_t end_time = clock();
    printf("预测耗时（s）: %f \n", (double) (end_time - start_time) / CLOCKS_PER_SEC);
#endif

    StorePredict(res, predict_file);
}